

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

optional<unsigned_int> __thiscall
(anonymous_namespace)::KeyParser::FromString<char_const*>(KeyParser *this,char *begin,char *end)

{
  ParseScriptContext ctx;
  ulong uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  pk;
  Span<const_char> local_48;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(FlatSigningProvider **)this == (FlatSigningProvider *)0x0) {
    __assert_fail("m_out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                  ,0x6a3,
                  "std::optional<Key> (anonymous namespace)::KeyParser::FromString(I, I) const [I = const char *]"
                 );
  }
  uVar2 = (int)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3) * -0x55555555;
  local_48.m_size = (long)end - (long)begin;
  ctx = P2WSH;
  local_48.m_data = begin;
  if (*(int *)(this + 0x48) != 0) {
    if (*(int *)(this + 0x48) != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                    ,0x69e,
                    "ParseScriptContext (anonymous namespace)::KeyParser::ParseContext() const");
    }
    ctx = P2TR;
  }
  anon_unknown.dwarf_1440904::ParsePubkey
            (&local_38,*(int *)(this + 0x4c) + uVar2,&local_48,ctx,*(FlatSigningProvider **)this,
             (string *)(this + 0x28));
  if (local_38.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_38.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = 0;
  }
  else {
    std::
    vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>,std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>>>
    ::
    emplace_back<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>>
              ((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>,std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>>>
                *)(this + 0x10),&local_38);
    uVar1 = 0x100000000;
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)(uVar1 | uVar2);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromString(I begin, I end) const
    {
        assert(m_out);
        Key key = m_keys.size();
        auto pk = ParsePubkey(m_offset + key, {&*begin, &*end}, ParseContext(), *m_out, m_key_parsing_error);
        if (pk.empty()) return {};
        m_keys.emplace_back(std::move(pk));
        return key;
    }